

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderGetProgramiv3Test::iterate(GeometryShaderGetProgramiv3Test *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  size_type sVar9;
  GLuint local_10d8;
  MessageBuilder local_1018;
  int local_e94;
  MessageBuilder local_e90;
  MessageBuilder local_d10;
  MessageBuilder local_b90;
  MessageBuilder local_a10;
  int local_88c;
  int local_888;
  GLint result_geometry_shader_invocations;
  GLint result_geometry_linked_output_type;
  GLint result_geometry_linked_input_type;
  GLint result_geometry_linked_vertices_out;
  GLuint po_id;
  int local_6f4;
  undefined1 local_6f0 [4];
  GLint link_status;
  MessageBuilder local_570;
  char *local_3f0;
  char *gs_code_specialized_raw;
  string gs_code_specialized;
  char *gs_code_raw;
  string gs_code;
  _run *current_run;
  undefined1 local_390 [7];
  bool should_use_separable_object;
  MessageBuilder local_210;
  char *local_90;
  char *dummy_vs_specialized_raw;
  string dummy_vs_specialized;
  char *dummy_fs_specialized_raw;
  string dummy_fs_specialized;
  uint local_2c;
  uint uStack_28;
  bool result;
  uint n_separable_object_case;
  uint n_run;
  GLint gs_spo_id;
  Functions *gl;
  GeometryShaderGetProgramiv3Test *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _n_run = CONCAT44(extraout_var,iVar3);
  n_separable_object_case = 0;
  bVar1 = true;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x3ce);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&dummy_fs_specialized_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
  dummy_vs_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&dummy_vs_specialized_raw,&this->super_TestCaseBase,1,&dummy_vs_code);
  local_90 = (char *)std::__cxx11::string::c_str();
  GVar4 = (**(code **)(_n_run + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(_n_run + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar4;
  GVar4 = (**(code **)(_n_run + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(_n_run + 0x800))();
  glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x3dd);
  bVar2 = buildShader(this,this->m_fs_id,(char *)dummy_vs_specialized.field_2._8_8_);
  if ((bVar2) && (bVar2 = buildShader(this,this->m_vs_id,local_90), bVar2)) {
    GVar4 = (**(code **)(_n_run + 0x3c8))();
    this->m_po_id = GVar4;
    dVar5 = (**(code **)(_n_run + 0x800))();
    glu::checkError(dVar5,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x3ea);
    (**(code **)(_n_run + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(_n_run + 0x10))(this->m_po_id,this->m_gs_id);
    (**(code **)(_n_run + 0x10))(this->m_po_id,this->m_vs_id);
    dVar5 = (**(code **)(_n_run + 0x800))();
    glu::checkError(dVar5,"glAttachShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x3ef);
    bVar2 = buildShaderProgram(this,&this->m_fs_po_id,0x8b30,
                               (char *)dummy_vs_specialized.field_2._8_8_);
    if ((bVar2) && (bVar2 = buildShaderProgram(this,&this->m_vs_po_id,0x8b31,local_90), bVar2)) {
      initTestRuns(this);
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        for (uStack_28 = 0;
            sVar9 = std::
                    vector<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
                    ::size(&this->_runs), uStack_28 < sVar9; uStack_28 = uStack_28 + 1) {
          gs_code.field_2._8_8_ =
               std::
               vector<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
               ::operator[](&this->_runs,(ulong)uStack_28);
          getGSCode_abi_cxx11_((string *)&gs_code_raw,this,(_run *)gs_code.field_2._8_8_);
          gs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
          TestCaseBase::specializeShader_abi_cxx11_
                    ((string *)&gs_code_specialized_raw,&this->super_TestCaseBase,1,
                     (char **)((long)&gs_code_specialized.field_2 + 8));
          local_3f0 = (char *)std::__cxx11::string::c_str();
          if (local_2c == 0) {
            (**(code **)(_n_run + 0x98))(0);
            dVar5 = (**(code **)(_n_run + 0x800))();
            glu::checkError(dVar5,"glBindProgramPipeline() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x422);
            bVar2 = buildShader(this,this->m_gs_id,local_3f0);
            if (bVar2) {
              local_6f4 = 0;
              (**(code **)(_n_run + 0xce8))(this->m_po_id);
              dVar5 = (**(code **)(_n_run + 0x800))();
              glu::checkError(dVar5,"glLinkProgram() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x432);
              (**(code **)(_n_run + 0x9d8))(this->m_po_id,0x8b82,&local_6f4);
              if (local_6f4 != 0) {
                (**(code **)(_n_run + 0x1680))(this->m_po_id);
                dVar5 = (**(code **)(_n_run + 0x800))();
                glu::checkError(dVar5,"glUseProgram() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                                ,0x441);
                goto LAB_0158d36e;
              }
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&result_geometry_linked_vertices_out,pTVar7,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&result_geometry_linked_vertices_out,
                                  (char (*) [35])"Test program object failed to link");
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder
                        ((MessageBuilder *)&result_geometry_linked_vertices_out);
              bVar1 = false;
              local_e94 = 2;
            }
            else {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        ((MessageBuilder *)local_6f0,pTVar7,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_6f0,
                                  (char (*) [44])"Failed to compile a geometry shader object.");
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_6f0);
              bVar1 = false;
              local_e94 = 2;
            }
          }
          else {
            deinitSPOs(this,false);
            bVar2 = buildShaderProgram(this,&this->m_gs_po_id,0x8dd9,local_3f0);
            if (bVar2) {
LAB_0158d36e:
              if (local_2c == 0) {
                local_10d8 = this->m_po_id;
              }
              else {
                local_10d8 = this->m_gs_po_id;
              }
              result_geometry_linked_input_type = local_10d8;
              result_geometry_linked_output_type = 0;
              result_geometry_shader_invocations = 0;
              local_888 = 0;
              local_88c = 0;
              (**(code **)(_n_run + 0x9d8))
                        (local_10d8,
                         (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT,
                         &result_geometry_linked_output_type);
              dVar5 = (**(code **)(_n_run + 0x800))();
              glu::checkError(dVar5,
                              "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_VERTICES_OUT_EXT query."
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x44d);
              (**(code **)(_n_run + 0x9d8))
                        (result_geometry_linked_input_type,
                         (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE,
                         &result_geometry_shader_invocations);
              dVar5 = (**(code **)(_n_run + 0x800))();
              glu::checkError(dVar5,
                              "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query."
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x451);
              (**(code **)(_n_run + 0x9d8))
                        (result_geometry_linked_input_type,
                         (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE,
                         &local_888);
              dVar5 = (**(code **)(_n_run + 0x800))();
              glu::checkError(dVar5,
                              "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query."
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x455);
              (**(code **)(_n_run + 0x9d8))
                        (result_geometry_linked_input_type,
                         (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS,
                         &local_88c);
              dVar5 = (**(code **)(_n_run + 0x800))();
              glu::checkError(dVar5,
                              "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query."
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x459);
              if (*(int *)gs_code.field_2._8_8_ != result_geometry_shader_invocations) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                    m_testCtx);
                tcu::TestLog::operator<<
                          (&local_a10,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_a10,
                                    (char (*) [47])"GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query value ")
                ;
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c3fdfc);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&result_geometry_shader_invocations)
                ;
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(char (*) [40])"] does not match the test run setting [")
                ;
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)gs_code.field_2._8_8_);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29ea7ce);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_a10);
                bVar1 = false;
              }
              if (*(int *)(gs_code.field_2._8_8_ + 4) != local_88c) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                    m_testCtx);
                tcu::TestLog::operator<<
                          (&local_b90,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_b90,
                                    (char (*) [48])"GL_GEOMETRY_SHADER_INVOCATIONS_EXT query value "
                                   );
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c3fdfc);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_88c);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(char (*) [40])"] does not match the test run setting [")
                ;
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)gs_code.field_2._8_8_);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29ea7ce);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_b90);
                bVar1 = false;
              }
              if (*(int *)(gs_code.field_2._8_8_ + 8) != result_geometry_linked_output_type) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                    m_testCtx);
                tcu::TestLog::operator<<
                          (&local_d10,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_d10,
                                    (char (*) [45])"GL_GEOMETRY_LINKED_VERTICES_OUT query value ");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c3fdfc);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&result_geometry_linked_output_type)
                ;
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(char (*) [40])"] does not match the test run setting [")
                ;
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(gs_code.field_2._8_8_ + 8));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29ea7ce);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_d10);
                bVar1 = false;
              }
              if (*(int *)(gs_code.field_2._8_8_ + 0xc) != local_888) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                    m_testCtx);
                tcu::TestLog::operator<<
                          (&local_e90,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_e90,
                                    (char (*) [48])"GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query value "
                                   );
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c3fdfc);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_888);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(char (*) [40])"] does not match the test run setting [")
                ;
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(uint *)(gs_code.field_2._8_8_ + 0xc));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29ea7ce);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_e90);
                bVar1 = false;
              }
              local_e94 = 0;
            }
            else {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_570,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_570,
                                  (char (*) [51])
                                  "Failed to compile a geometry shader program object");
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_570);
              bVar1 = false;
              local_e94 = 2;
            }
          }
          std::__cxx11::string::~string((string *)&gs_code_specialized_raw);
          std::__cxx11::string::~string((string *)&gs_code_raw);
          if (local_e94 != 0) {
            if (local_e94 != 2) goto LAB_0158dd28;
            goto LAB_0158dcd4;
          }
        }
      }
      (**(code **)(_n_run + 0x6d8))(1,&this->m_pipeline_object_id);
      dVar5 = (**(code **)(_n_run + 0x800))();
      glu::checkError(dVar5,"glGenProgramPipelines() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x490);
      (**(code **)(_n_run + 0x1688))(this->m_pipeline_object_id,2,this->m_fs_po_id);
      (**(code **)(_n_run + 0x1688))(this->m_pipeline_object_id,1,this->m_vs_po_id);
      dVar5 = (**(code **)(_n_run + 0x800))();
      glu::checkError(dVar5,"glUseProgramStages() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x494);
      (**(code **)(_n_run + 0x9a0))
                (this->m_pipeline_object_id,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER
                 ,&n_separable_object_case);
      dVar5 = (**(code **)(_n_run + 0x800))();
      glu::checkError(dVar5,"glGetProgramPipelineiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x497);
      if (n_separable_object_case != 0) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1018,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_1018,(char (*) [27])"Pipeline object reported [");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&n_separable_object_case);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29ea7ce);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [68])
                                   " for GL_GEOMETRY_SHADER_EXT query, even though no GS SPO was bound."
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1018);
        bVar1 = false;
      }
    }
    else {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_390,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_390,
                          (char (*) [38])"Either FS or VS SPOs failed to build.");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_390);
      bVar1 = false;
    }
  }
  else {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_210,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_210,(char (*) [33])"Either FS or VS failed to build.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    bVar1 = false;
  }
LAB_0158dcd4:
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  this_local._4_4_ = STOP;
  local_e94 = 1;
LAB_0158dd28:
  std::__cxx11::string::~string((string *)&dummy_vs_specialized_raw);
  std::__cxx11::string::~string((string *)&dummy_fs_specialized_raw);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetProgramiv3Test::iterate()
{
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gs_spo_id				  = 0;
	unsigned int		  n_run					  = 0;
	unsigned int		  n_separable_object_case = 0;
	bool				  result				  = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Prepare specialized versions of dummy fragment & vertex shaders */
	std::string dummy_fs_specialized = specializeShader(1,
														/* parts */ &dummy_fs_code);
	const char* dummy_fs_specialized_raw = dummy_fs_specialized.c_str();
	std::string dummy_vs_specialized	 = specializeShader(1, &dummy_vs_code);
	const char* dummy_vs_specialized_raw = dummy_vs_specialized.c_str();

	/* Set up the fragment & the vertex shaders */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	if (!buildShader(m_fs_id, dummy_fs_specialized_raw) || !buildShader(m_vs_id, dummy_vs_specialized_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Either FS or VS failed to build." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up the test program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_gs_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	/* Set up the fragment & the vertex shader programs */
	if (!buildShaderProgram(&m_fs_po_id, GL_FRAGMENT_SHADER, dummy_fs_specialized_raw) ||
		!buildShaderProgram(&m_vs_po_id, GL_VERTEX_SHADER, dummy_vs_specialized_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Either FS or VS SPOs failed to build."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up test runs */
	initTestRuns();

	/* The test should check both a geometry shader program object and a full-blown PO
	 * consisting of FS, GS and VS. */
	for (n_separable_object_case = 0; n_separable_object_case < 2; /* PO, SPO cases */
		 ++n_separable_object_case)
	{
		bool should_use_separable_object = (n_separable_object_case != 0);

		/* Iterate over all test runs */
		for (n_run = 0; n_run < _runs.size(); ++n_run)
		{
			const _run& current_run			= _runs[n_run];
			std::string gs_code				= getGSCode(current_run);
			const char* gs_code_raw			= gs_code.c_str();
			std::string gs_code_specialized = specializeShader(1, /* parts */
															   &gs_code_raw);
			const char* gs_code_specialized_raw = gs_code_specialized.c_str();

			if (should_use_separable_object)
			{
				/* Deinitialize any objects that may have been created in previous iterations */
				deinitSPOs(false);

				/* Set up the geometry shader program object */
				if (!buildShaderProgram(&m_gs_po_id, GL_GEOMETRY_SHADER, gs_code_specialized_raw))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Failed to compile a geometry shader program object"
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* if (should_use_pipeline_object) */
			else
			{
				gl.bindProgramPipeline(0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

				/* Set up the geometry shader object */
				if (!buildShader(m_gs_id, gs_code_specialized_raw))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Failed to compile a geometry shader object."
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}

				/* Set up the program object */
				glw::GLint link_status = GL_FALSE;

				gl.linkProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

				gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);

				if (link_status == GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Test program object failed to link"
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}

				/* Bind the PO to the rendering context */
				gl.useProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
			}

			/* Execute the queries */
			glw::GLuint po_id								= (should_use_separable_object) ? m_gs_po_id : m_po_id;
			glw::GLint  result_geometry_linked_vertices_out = 0;
			glw::GLint  result_geometry_linked_input_type   = 0;
			glw::GLint  result_geometry_linked_output_type  = 0;
			glw::GLint  result_geometry_shader_invocations  = 0;

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT, &result_geometry_linked_vertices_out);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_VERTICES_OUT_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE, &result_geometry_linked_input_type);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE, &result_geometry_linked_output_type);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS, &result_geometry_shader_invocations);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.");

			if (current_run.input_primitive_type != (glw::GLenum)result_geometry_linked_input_type)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query value "
								   << "[" << result_geometry_linked_input_type
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.input_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.invocations != result_geometry_shader_invocations)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_SHADER_INVOCATIONS_EXT query value "
								   << "[" << result_geometry_shader_invocations
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.input_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.max_vertices != result_geometry_linked_vertices_out)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_VERTICES_OUT query value "
								   << "[" << result_geometry_linked_vertices_out
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.max_vertices << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.output_primitive_type != (glw::GLenum)result_geometry_linked_output_type)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query value "
								   << "[" << result_geometry_linked_output_type
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.output_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all test runs) */
	}	 /* for (PO & SPO cases) */

	/* One more check: build a pipeline object which only defines a FS & VS stages,
	 *                 and check what GS SPO ID the object reports. */
	gl.genProgramPipelines(1, &m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.useProgramStages(m_pipeline_object_id, GL_FRAGMENT_SHADER_BIT, m_fs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_VERTEX_SHADER_BIT, m_vs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

	gl.getProgramPipelineiv(m_pipeline_object_id, m_glExtTokens.GEOMETRY_SHADER, &gs_spo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

	if (gs_spo_id != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Pipeline object reported [" << gs_spo_id << "]"
						   << " for GL_GEOMETRY_SHADER_EXT query, even though no GS SPO was bound."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}